

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

SRes SzReadAndDecodePackedStreams
               (ILookInStream *inStream,CSzData *sd,CBuf *tempBufs,UInt32 numFoldersMax,
               UInt64 baseOffset,CSzAr *p,ISzAlloc *allocTemp)

{
  int iVar1;
  SRes SVar2;
  long in_RDX;
  CSzAr *in_R9;
  ILookInStream *in_stack_00000008;
  int __result___2;
  int __result___1;
  CBuf *tempBuf_1;
  UInt64 unpackSize;
  CBuf *tempBuf;
  Byte *in_stack_00000030;
  int __result__;
  CSubStreamInfo ssi;
  ISzAlloc *in_stack_00000070;
  UInt32 fo;
  UInt64 dataStartPos;
  ILookInStream *alloc;
  ILookInStream *stream;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  UInt64 *in_stack_ffffffffffffff70;
  UInt32 in_stack_ffffffffffffff7c;
  CBuf *in_stack_ffffffffffffff80;
  UInt32 in_stack_ffffffffffffff8c;
  CSzData *in_stack_ffffffffffffff90;
  CSzAr *in_stack_ffffffffffffff98;
  CSubStreamInfo *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar3;
  SRes local_4;
  
  alloc = (ILookInStream *)&stack0xffffffffffffff80;
  stream = in_stack_00000008;
  local_4 = SzReadStreamsInfo(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                              in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,
                              in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
                              in_stack_ffffffffffffffb0,
                              (ISzAlloc *)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (local_4 == 0) {
    if (in_R9->NumFolders == 0) {
      local_4 = 0x10;
    }
    else {
      for (uVar3 = 0; uVar3 < in_R9->NumFolders; uVar3 = uVar3 + 1) {
        Buf_Init((CBuf *)(in_RDX + (ulong)uVar3 * 0x10));
      }
      for (uVar3 = 0; uVar3 < in_R9->NumFolders; uVar3 = uVar3 + 1) {
        SzAr_GetFolderUnpackSize(in_R9,uVar3);
        iVar1 = Buf_Create((CBuf *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                           (size_t)stream,(ISzAlloc *)alloc);
        if (iVar1 == 0) {
          return 2;
        }
      }
      for (uVar3 = 0; uVar3 < in_R9->NumFolders; uVar3 = uVar3 + 1) {
        SVar2 = LookInStream_SeekTo(stream,(UInt64)alloc);
        if (SVar2 != 0) {
          return SVar2;
        }
        alloc = in_stack_00000008;
        SVar2 = SzAr_DecodeFolder((CSzAr *)ssi.sdSizes.Data,ssi.sdNumSubStreams.Size._4_4_,
                                  (ILookInStream *)ssi.sdNumSubStreams.Data,ssi._0_8_,
                                  in_stack_00000030,(size_t)tempBuf,in_stack_00000070);
        if (SVar2 != 0) {
          return SVar2;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static SRes SzReadAndDecodePackedStreams(
    ILookInStream *inStream,
    CSzData *sd,
    CBuf *tempBufs,
    UInt32 numFoldersMax,
    UInt64 baseOffset,
    CSzAr *p,
    ISzAlloc *allocTemp)
{
  UInt64 dataStartPos;
  UInt32 fo;
  CSubStreamInfo ssi;

  RINOK(SzReadStreamsInfo(p, sd, numFoldersMax, NULL, 0, &dataStartPos, &ssi, allocTemp));
  
  dataStartPos += baseOffset;
  if (p->NumFolders == 0)
    return SZ_ERROR_ARCHIVE;
 
  for (fo = 0; fo < p->NumFolders; fo++)
    Buf_Init(tempBufs + fo);
  
  for (fo = 0; fo < p->NumFolders; fo++)
  {
    CBuf *tempBuf = tempBufs + fo;
    UInt64 unpackSize = SzAr_GetFolderUnpackSize(p, fo);
    if ((size_t)unpackSize != unpackSize)
      return SZ_ERROR_MEM;
    if (!Buf_Create(tempBuf, (size_t)unpackSize, allocTemp))
      return SZ_ERROR_MEM;
  }
  
  for (fo = 0; fo < p->NumFolders; fo++)
  {
    const CBuf *tempBuf = tempBufs + fo;
    RINOK(LookInStream_SeekTo(inStream, dataStartPos));
    RINOK(SzAr_DecodeFolder(p, fo, inStream, dataStartPos, tempBuf->data, tempBuf->size, allocTemp));
  }
  
  return SZ_OK;
}